

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_constraint_handler_s.c
# Opt level: O1

int main(void)

{
  constraint_handler_t p_Var1;
  
  if (_PDCLIB_constraint_handler != abort_handler_s) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/set_constraint_handler_s.c, line %d - %s\n"
           ,0x27,"_PDCLIB_constraint_handler == abort_handler_s");
  }
  p_Var1 = _PDCLIB_constraint_handler;
  _PDCLIB_constraint_handler = ignore_handler_s;
  if (p_Var1 != abort_handler_s) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/set_constraint_handler_s.c, line %d - %s\n"
           ,0x28,"set_constraint_handler_s( ignore_handler_s ) == abort_handler_s");
  }
  if (_PDCLIB_constraint_handler != ignore_handler_s) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/set_constraint_handler_s.c, line %d - %s\n"
           ,0x29,"_PDCLIB_constraint_handler == ignore_handler_s");
  }
  p_Var1 = _PDCLIB_constraint_handler;
  _PDCLIB_constraint_handler = abort_handler_s;
  if (p_Var1 != ignore_handler_s) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/set_constraint_handler_s.c, line %d - %s\n"
           ,0x2a,"set_constraint_handler_s( NULL ) == ignore_handler_s");
  }
  if (_PDCLIB_constraint_handler != abort_handler_s) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/set_constraint_handler_s.c, line %d - %s\n"
           ,0x2b,"_PDCLIB_constraint_handler == abort_handler_s");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    TESTCASE( _PDCLIB_constraint_handler == abort_handler_s );
    TESTCASE( set_constraint_handler_s( ignore_handler_s ) == abort_handler_s );
    TESTCASE( _PDCLIB_constraint_handler == ignore_handler_s );
    TESTCASE( set_constraint_handler_s( NULL ) == ignore_handler_s );
    TESTCASE( _PDCLIB_constraint_handler == abort_handler_s );
#endif
    return TEST_RESULTS;
}